

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputWarningComment(ostream *fout,string *message,bool wrapSpaces)

{
  char *pcVar1;
  ostream *poVar2;
  string local_88 [48];
  ulong local_58;
  size_type i;
  size_type pos;
  string oneLine;
  size_type end;
  bool wrapSpaces_local;
  string *message_local;
  ostream *fout_local;
  
  oneLine.field_2._8_8_ = std::__cxx11::string::size();
  std::__cxx11::string::string((string *)&pos);
  i = 0;
  local_58 = 0;
  do {
    if ((ulong)oneLine.field_2._8_8_ < local_58) {
      std::__cxx11::string::~string((string *)&pos);
      return;
    }
    if (local_58 == oneLine.field_2._8_8_) {
LAB_003e3802:
      std::operator<<(fout,"# ");
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)message);
      if (*pcVar1 == '\n') {
        i = i + 1;
        std::operator<<(fout,"\\n");
      }
      std::__cxx11::string::substr((ulong)local_88,(ulong)message);
      std::__cxx11::string::operator=((string *)&pos,local_88);
      std::__cxx11::string::~string(local_88);
      poVar2 = std::operator<<(fout,(string *)&pos);
      std::operator<<(poVar2,"\n");
      i = local_58;
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)message);
      if (*pcVar1 == '\n') goto LAB_003e3802;
      if (0x3b < local_58 - i) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)message);
        if ((*pcVar1 == ' ') && (wrapSpaces)) goto LAB_003e3802;
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void cmCacheManager::OutputWarningComment(std::ostream& fout,
                                          std::string const& message,
                                          bool wrapSpaces)
{
  std::string::size_type end = message.size();
  std::string oneLine;
  std::string::size_type pos = 0;
  for (std::string::size_type i = 0; i <= end; i++) {
    if ((i == end) || (message[i] == '\n') ||
        ((i - pos >= 60) && (message[i] == ' ') && wrapSpaces)) {
      fout << "# ";
      if (message[pos] == '\n') {
        pos++;
        fout << "\\n";
      }
      oneLine = message.substr(pos, i - pos);
      fout << oneLine << "\n";
      pos = i;
    }
  }
}